

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::TokenManager::Init
          (Error *__return_storage_ptr__,TokenManager *this,Config *aConfig)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_1a4;
  DtlsConfig local_1a0;
  Error local_138;
  ErrorCode local_10c;
  Error local_108;
  ErrorCode local_dc;
  Error local_d8;
  ErrorCode local_ac;
  Error local_a8;
  undefined1 local_70 [8];
  mbedtls_pk_context_conflict trustAnchorPublicKey;
  mbedtls_pk_context_conflict privateKey;
  mbedtls_pk_context_conflict publicKey;
  Config *aConfig_local;
  TokenManager *this_local;
  Error *error;
  
  Error::Error(__return_storage_ptr__);
  mbedtls_pk_init((mbedtls_pk_context *)&privateKey.private_priv_id);
  mbedtls_pk_init((mbedtls_pk_context *)&trustAnchorPublicKey.private_priv_id);
  mbedtls_pk_init((mbedtls_pk_context *)local_70);
  ParsePublicKey(&local_a8,this,(mbedtls_pk_context_conflict *)&privateKey.private_priv_id,
                 &aConfig->mCertificate);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_a8);
  local_ac = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_ac);
  Error::~Error(&local_a8);
  if (!bVar1) {
    ParsePrivateKey(&local_d8,this,
                    (mbedtls_pk_context_conflict *)&trustAnchorPublicKey.private_priv_id,
                    &aConfig->mPrivateKey);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_d8);
    local_dc = kNone;
    bVar1 = commissioner::operator!=(pEVar2,&local_dc);
    Error::~Error(&local_d8);
    if (!bVar1) {
      ParsePublicKey(&local_108,this,(mbedtls_pk_context_conflict *)local_70,&aConfig->mTrustAnchor)
      ;
      pEVar2 = Error::operator=(__return_storage_ptr__,&local_108);
      local_10c = kNone;
      bVar1 = commissioner::operator!=(pEVar2,&local_10c);
      Error::~Error(&local_108);
      if (!bVar1) {
        GetDtlsConfig(&local_1a0,aConfig);
        coap::CoapSecure::Init(&local_138,&this->mRegistrarClient,&local_1a0);
        pEVar2 = Error::operator=(__return_storage_ptr__,&local_138);
        local_1a4 = kNone;
        bVar1 = commissioner::operator!=(pEVar2,&local_1a4);
        Error::~Error(&local_138);
        DtlsConfig::~DtlsConfig(&local_1a0);
        if (!bVar1) {
          std::__cxx11::string::operator=((string *)&this->mCommissionerId,(string *)&aConfig->mId);
          std::__cxx11::string::operator=
                    ((string *)&this->mDomainName,(string *)&aConfig->mDomainName);
          MoveMbedtlsKey(&this->mPublicKey,
                         (mbedtls_pk_context_conflict *)&privateKey.private_priv_id);
          MoveMbedtlsKey(&this->mPrivateKey,
                         (mbedtls_pk_context_conflict *)&trustAnchorPublicKey.private_priv_id);
          MoveMbedtlsKey(&this->mDomainCAPublicKey,(mbedtls_pk_context_conflict *)local_70);
        }
      }
    }
  }
  mbedtls_pk_free((mbedtls_pk_context *)local_70);
  mbedtls_pk_free((mbedtls_pk_context *)&trustAnchorPublicKey.private_priv_id);
  mbedtls_pk_free((mbedtls_pk_context *)&privateKey.private_priv_id);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::Init(const Config &aConfig)
{
    Error              error;
    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;
    mbedtls_pk_context trustAnchorPublicKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);
    mbedtls_pk_init(&trustAnchorPublicKey);

    SuccessOrExit(error = ParsePublicKey(publicKey, aConfig.mCertificate));
    SuccessOrExit(error = ParsePrivateKey(privateKey, aConfig.mPrivateKey));
    SuccessOrExit(error = ParsePublicKey(trustAnchorPublicKey, aConfig.mTrustAnchor));

    SuccessOrExit(error = mRegistrarClient.Init(GetDtlsConfig(aConfig)));

    mCommissionerId = aConfig.mId;
    mDomainName     = aConfig.mDomainName;

    // Move mbedtls keys
    MoveMbedtlsKey(mPublicKey, publicKey);
    MoveMbedtlsKey(mPrivateKey, privateKey);
    MoveMbedtlsKey(mDomainCAPublicKey, trustAnchorPublicKey);

exit:
    mbedtls_pk_free(&trustAnchorPublicKey);
    mbedtls_pk_free(&privateKey);
    mbedtls_pk_free(&publicKey);
    return error;
}